

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::memorySemanticsCheck
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermOperator *callNode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TOperator TVar4;
  undefined4 extraout_var;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  const_reference ppTVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  TSampler *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TConstUnionArray *pTVar7;
  TConstUnion *pTVar8;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  char *pcVar9;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  bool local_72;
  bool isMS;
  TIntermTyped *arg0;
  uint storageClassSemantics2;
  uint semantics2;
  uint storageClassSemantics;
  uint semantics;
  int gl_StorageSemanticsOutput;
  int gl_StorageSemanticsImage;
  int gl_StorageSemanticsShared;
  int gl_StorageSemanticsBuffer;
  int gl_SemanticsVolatile;
  int gl_SemanticsMakeVisible;
  int gl_SemanticsMakeAvailable;
  int gl_SemanticsAcquireRelease;
  int gl_SemanticsRelease;
  int gl_SemanticsAcquire;
  TIntermSequence *argp;
  TIntermOperator *callNode_local;
  TFunction *fnCandidate_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar2 = (*(callNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x12])();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x198))();
  semantics2 = 0;
  storageClassSemantics2 = 0;
  arg0._4_4_ = 0;
  arg0._0_4_ = 0;
  ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (this_00,0);
  iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[3])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x100))();
  local_72 = false;
  if (iVar3 == 0xe) {
    plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))();
    this_01 = (TSampler *)(**(code **)(*plVar6 + 0x40))();
    local_72 = TSampler::isMultiSample(this_01);
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if (TVar4 == EOpBarrier) {
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,2);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_17,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,3);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_18,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    semantics2 = TConstUnion::getIConst(pTVar8);
  }
  else if (TVar4 == EOpMemoryBarrier) {
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,1);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_19,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,2);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_20,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    semantics2 = TConstUnion::getIConst(pTVar8);
  }
  else {
    if (7 < TVar4 - EOpAtomicAdd) {
      if (TVar4 == EOpAtomicCompSwap) {
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,4);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_05,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,5);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_06,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        semantics2 = TConstUnion::getIConst(pTVar8);
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,6);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_07,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        arg0._0_4_ = TConstUnion::getIConst(pTVar8);
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,7);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_08,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        arg0._4_4_ = TConstUnion::getIConst(pTVar8);
        goto LAB_0075ef1e;
      }
      if (TVar4 == EOpAtomicLoad) {
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,2);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_03,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,3);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_04,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        semantics2 = TConstUnion::getIConst(pTVar8);
        goto LAB_0075ef1e;
      }
      if (TVar4 != EOpAtomicStore) {
        if (6 < TVar4 - EOpImageAtomicAdd) {
          if (TVar4 == EOpImageAtomicCompSwap) {
            iVar2 = 5;
            if (local_72 != false) {
              iVar2 = 6;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_13,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
            iVar2 = 6;
            if (local_72 != false) {
              iVar2 = 7;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_14,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            semantics2 = TConstUnion::getIConst(pTVar8);
            iVar2 = 7;
            if (local_72 != false) {
              iVar2 = 8;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_15,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            arg0._0_4_ = TConstUnion::getIConst(pTVar8);
            iVar2 = 8;
            if (local_72 != false) {
              iVar2 = 9;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_16,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            arg0._4_4_ = TConstUnion::getIConst(pTVar8);
            goto LAB_0075ef1e;
          }
          if (TVar4 == EOpImageAtomicLoad) {
            iVar2 = 3;
            if (local_72 != false) {
              iVar2 = 4;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_11,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
            iVar2 = 4;
            if (local_72 != false) {
              iVar2 = 5;
            }
            ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](this_00,(long)iVar2);
            iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
            pTVar7 = TIntermConstantUnion::getConstArray
                               ((TIntermConstantUnion *)CONCAT44(extraout_var_12,iVar2));
            pTVar8 = TConstUnionArray::operator[](pTVar7,0);
            semantics2 = TConstUnion::getIConst(pTVar8);
            goto LAB_0075ef1e;
          }
          if (TVar4 != EOpImageAtomicStore) goto LAB_0075ef1e;
        }
        iVar2 = 4;
        if (local_72 != false) {
          iVar2 = 5;
        }
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,(long)iVar2);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_09,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
        iVar2 = 5;
        if (local_72 != false) {
          iVar2 = 6;
        }
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (this_00,(long)iVar2);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        pTVar7 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_10,iVar2));
        pTVar8 = TConstUnionArray::operator[](pTVar7,0);
        semantics2 = TConstUnion::getIConst(pTVar8);
        goto LAB_0075ef1e;
      }
    }
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,3);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_01,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    storageClassSemantics2 = TConstUnion::getIConst(pTVar8);
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,4);
    iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
    pTVar7 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var_02,iVar2));
    pTVar8 = TConstUnionArray::operator[](pTVar7,0);
    semantics2 = TConstUnion::getIConst(pTVar8);
  }
LAB_0075ef1e:
  if (((semantics2 & 2) != 0) &&
     ((TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpAtomicStore ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicStore)))) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_21,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsAcquire must not be used with (image) atomic store",pcVar9,"");
  }
  if (((semantics2 & 4) != 0) &&
     ((TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpAtomicLoad ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicLoad)))) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_22,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsRelease must not be used with (image) atomic load",pcVar9,"");
  }
  if (((semantics2 & 8) != 0) &&
     ((((TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpAtomicStore ||
        (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicStore)) ||
       (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpAtomicLoad)) ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicLoad)))) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_23,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsAcquireRelease must not be used with (image) atomic load/store"
               ,pcVar9,"");
  }
  if (((semantics2 | arg0._4_4_) & 0xffff1ff1) != 0) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_24,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Invalid semantics value",pcVar9,"");
  }
  if (((storageClassSemantics2 | (uint)arg0) & 0xffffe6bf) != 0) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_25,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Invalid storage class semantics value",pcVar9,"");
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if (TVar4 == EOpMemoryBarrier) {
    bVar1 = IsPow2<unsigned_int>(semantics2 & 0xe);
    if (!bVar1) {
      iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_26,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "Semantics must include exactly one of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
                 ,pcVar9,"");
    }
  }
  else {
    if (((semantics2 & 0xe) != 0) && (bVar1 = IsPow2<unsigned_int>(semantics2 & 0xe), !bVar1)) {
      iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_27,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "Semantics must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
                 ,pcVar9,"");
    }
    if (((arg0._4_4_ & 0xe) != 0) && (bVar1 = IsPow2<unsigned_int>(arg0._4_4_ & 0xe), !bVar1)) {
      iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_28,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "semUnequal must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or gl_SemanticsAcquireRelease"
                 ,pcVar9,"");
    }
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if ((TVar4 == EOpMemoryBarrier) && (storageClassSemantics2 == 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_29,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Storage class semantics must not be zero",pcVar9,"");
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if (((TVar4 == EOpBarrier) && (semantics2 != 0)) && (storageClassSemantics2 == 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_30,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"Storage class semantics must not be zero",pcVar9,"");
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if (((TVar4 == EOpAtomicCompSwap) ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicCompSwap)) &&
     ((arg0._4_4_ & 0xc) != 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_31,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"semUnequal must not be gl_SemanticsRelease or gl_SemanticsAcquireRelease",
               pcVar9,"");
  }
  if (((semantics2 & 0x2000) != 0) && ((semantics2 & 0xc) == 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_32,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "gl_SemanticsMakeAvailable requires gl_SemanticsRelease or gl_SemanticsAcquireRelease"
               ,pcVar9,"");
  }
  if (((semantics2 & 0x4000) != 0) && ((semantics2 & 10) == 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_33,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "gl_SemanticsMakeVisible requires gl_SemanticsAcquire or gl_SemanticsAcquireRelease",
               pcVar9,"");
  }
  if (((semantics2 & 0x8000) != 0) &&
     ((TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpMemoryBarrier ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpBarrier)))) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_34,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"gl_SemanticsVolatile must not be used with memoryBarrier or controlBarrier"
               ,pcVar9,"");
  }
  TVar4 = TIntermOperator::getOp(callNode);
  if (((TVar4 == EOpAtomicCompSwap) ||
      (TVar4 = TIntermOperator::getOp(callNode), TVar4 == EOpImageAtomicCompSwap)) &&
     (((semantics2 ^ arg0._4_4_) & 0x8000) != 0)) {
    iVar2 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[3])();
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_35,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "semEqual and semUnequal must either both include gl_SemanticsVolatile or neither",
               pcVar9,"");
  }
  return;
}

Assistant:

void TParseContext::memorySemanticsCheck(const TSourceLoc& loc, const TFunction& fnCandidate, const TIntermOperator& callNode)
{
    const TIntermSequence* argp = &callNode.getAsAggregate()->getSequence();

    //const int gl_SemanticsRelaxed         = 0x0;
    const int gl_SemanticsAcquire         = 0x2;
    const int gl_SemanticsRelease         = 0x4;
    const int gl_SemanticsAcquireRelease  = 0x8;
    const int gl_SemanticsMakeAvailable   = 0x2000;
    const int gl_SemanticsMakeVisible     = 0x4000;
    const int gl_SemanticsVolatile        = 0x8000;

    //const int gl_StorageSemanticsNone     = 0x0;
    const int gl_StorageSemanticsBuffer   = 0x40;
    const int gl_StorageSemanticsShared   = 0x100;
    const int gl_StorageSemanticsImage    = 0x800;
    const int gl_StorageSemanticsOutput   = 0x1000;


    unsigned int semantics = 0, storageClassSemantics = 0;
    unsigned int semantics2 = 0, storageClassSemantics2 = 0;

    const TIntermTyped* arg0 = (*argp)[0]->getAsTyped();
    const bool isMS = arg0->getBasicType() == EbtSampler && arg0->getType().getSampler().isMultiSample();

    // Grab the semantics and storage class semantics from the operands, based on opcode
    switch (callNode.getOp()) {
    case EOpAtomicAdd:
    case EOpAtomicSubtract:
    case EOpAtomicMin:
    case EOpAtomicMax:
    case EOpAtomicAnd:
    case EOpAtomicOr:
    case EOpAtomicXor:
    case EOpAtomicExchange:
    case EOpAtomicStore:
        storageClassSemantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpAtomicLoad:
        storageClassSemantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpAtomicCompSwap:
        storageClassSemantics = (*argp)[4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        storageClassSemantics2 = (*argp)[6]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics2 = (*argp)[7]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;

    case EOpImageAtomicAdd:
    case EOpImageAtomicMin:
    case EOpImageAtomicMax:
    case EOpImageAtomicAnd:
    case EOpImageAtomicOr:
    case EOpImageAtomicXor:
    case EOpImageAtomicExchange:
    case EOpImageAtomicStore:
        storageClassSemantics = (*argp)[isMS ? 5 : 4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 6 : 5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpImageAtomicLoad:
        storageClassSemantics = (*argp)[isMS ? 4 : 3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 5 : 4]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpImageAtomicCompSwap:
        storageClassSemantics = (*argp)[isMS ? 6 : 5]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[isMS ? 7 : 6]->getAsConstantUnion()->getConstArray()[0].getIConst();
        storageClassSemantics2 = (*argp)[isMS ? 8 : 7]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics2 = (*argp)[isMS ? 9 : 8]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;

    case EOpBarrier:
        storageClassSemantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[3]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    case EOpMemoryBarrier:
        storageClassSemantics = (*argp)[1]->getAsConstantUnion()->getConstArray()[0].getIConst();
        semantics = (*argp)[2]->getAsConstantUnion()->getConstArray()[0].getIConst();
        break;
    default:
        break;
    }

    if ((semantics & gl_SemanticsAcquire) &&
        (callNode.getOp() == EOpAtomicStore || callNode.getOp() == EOpImageAtomicStore)) {
        error(loc, "gl_SemanticsAcquire must not be used with (image) atomic store",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsRelease) &&
        (callNode.getOp() == EOpAtomicLoad || callNode.getOp() == EOpImageAtomicLoad)) {
        error(loc, "gl_SemanticsRelease must not be used with (image) atomic load",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsAcquireRelease) &&
        (callNode.getOp() == EOpAtomicStore || callNode.getOp() == EOpImageAtomicStore ||
         callNode.getOp() == EOpAtomicLoad  || callNode.getOp() == EOpImageAtomicLoad)) {
        error(loc, "gl_SemanticsAcquireRelease must not be used with (image) atomic load/store",
              fnCandidate.getName().c_str(), "");
    }
    if (((semantics | semantics2) & ~(gl_SemanticsAcquire |
                                      gl_SemanticsRelease |
                                      gl_SemanticsAcquireRelease |
                                      gl_SemanticsMakeAvailable |
                                      gl_SemanticsMakeVisible |
                                      gl_SemanticsVolatile))) {
        error(loc, "Invalid semantics value", fnCandidate.getName().c_str(), "");
    }
    if (((storageClassSemantics | storageClassSemantics2) & ~(gl_StorageSemanticsBuffer |
                                                              gl_StorageSemanticsShared |
                                                              gl_StorageSemanticsImage |
                                                              gl_StorageSemanticsOutput))) {
        error(loc, "Invalid storage class semantics value", fnCandidate.getName().c_str(), "");
    }

    if (callNode.getOp() == EOpMemoryBarrier) {
        if (!IsPow2(semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
            error(loc, "Semantics must include exactly one of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                       "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
        }
    } else {
        if (semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease)) {
            if (!IsPow2(semantics & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
                error(loc, "Semantics must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                           "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
            }
        }
        if (semantics2 & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease)) {
            if (!IsPow2(semantics2 & (gl_SemanticsAcquire | gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
                error(loc, "semUnequal must not include multiple of gl_SemanticsRelease, gl_SemanticsAcquire, or "
                           "gl_SemanticsAcquireRelease", fnCandidate.getName().c_str(), "");
            }
        }
    }
    if (callNode.getOp() == EOpMemoryBarrier) {
        if (storageClassSemantics == 0) {
            error(loc, "Storage class semantics must not be zero", fnCandidate.getName().c_str(), "");
        }
    }
    if (callNode.getOp() == EOpBarrier && semantics != 0 && storageClassSemantics == 0) {
        error(loc, "Storage class semantics must not be zero", fnCandidate.getName().c_str(), "");
    }
    if ((callNode.getOp() == EOpAtomicCompSwap || callNode.getOp() == EOpImageAtomicCompSwap) &&
        (semantics2 & (gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
        error(loc, "semUnequal must not be gl_SemanticsRelease or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsMakeAvailable) &&
        !(semantics & (gl_SemanticsRelease | gl_SemanticsAcquireRelease))) {
        error(loc, "gl_SemanticsMakeAvailable requires gl_SemanticsRelease or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsMakeVisible) &&
        !(semantics & (gl_SemanticsAcquire | gl_SemanticsAcquireRelease))) {
        error(loc, "gl_SemanticsMakeVisible requires gl_SemanticsAcquire or gl_SemanticsAcquireRelease",
              fnCandidate.getName().c_str(), "");
    }
    if ((semantics & gl_SemanticsVolatile) &&
        (callNode.getOp() == EOpMemoryBarrier || callNode.getOp() == EOpBarrier)) {
        error(loc, "gl_SemanticsVolatile must not be used with memoryBarrier or controlBarrier",
              fnCandidate.getName().c_str(), "");
    }
    if ((callNode.getOp() == EOpAtomicCompSwap || callNode.getOp() == EOpImageAtomicCompSwap) &&
        ((semantics ^ semantics2) & gl_SemanticsVolatile)) {
        error(loc, "semEqual and semUnequal must either both include gl_SemanticsVolatile or neither",
              fnCandidate.getName().c_str(), "");
    }
}